

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

string * __thiscall
chaiscript::eval::Arg_List_AST_Node::pretty_print_abi_cxx11_(Arg_List_AST_Node *this)

{
  ulong uVar1;
  size_type sVar2;
  element_type *peVar3;
  long in_RSI;
  string *in_RDI;
  size_t j;
  ostringstream oss;
  string local_1c0 [48];
  ulong local_190;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_190 = 0;
  while( true ) {
    uVar1 = local_190;
    sVar2 = std::
            vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                    *)(in_RSI + 0x60));
    if (sVar2 <= uVar1) break;
    if (local_190 != 0) {
      std::operator<<((ostream *)local_188,", ");
    }
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),local_190);
    peVar3 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ce518);
    (**peVar3->_vptr_AST_Node)(local_1c0);
    std::operator<<((ostream *)local_188,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    local_190 = local_190 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

virtual std::string pretty_print() const CHAISCRIPT_OVERRIDE 
        {
          std::ostringstream oss;
          for (size_t j = 0; j < this->children.size(); ++j) {
            if (j != 0)
            {
              oss << ", ";
            }

            oss << this->children[j]->pretty_print();
          }

          return oss.str();
        }